

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

HandlePtr dg::vr::RelationsAnalyzer::getHandleFromFroms
                    (ValueRelations *toRels,ValueRelations *fromRels,V val)

{
  HandlePtr pBVar1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> froms;
  _Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> _Stack_28;
  
  getFroms((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&_Stack_28,fromRels,
           val);
  pBVar1 = getHandleFromFroms(toRels,(vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                      *)&_Stack_28);
  std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
            (&_Stack_28);
  return pBVar1;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getHandleFromFroms(const ValueRelations &toRels,
                                      const ValueRelations &fromRels, V val) {
    auto froms = getFroms(fromRels, val);
    auto to = getHandleFromFroms(toRels, froms);
    return to;
}